

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void * __thiscall
google::protobuf::Reflection::GetRawRepeatedField
          (Reflection *this,Message *message,FieldDescriptor *field,CppType cpptype,int ctype,
          Descriptor *desc)

{
  byte bVar1;
  uint32_t uVar2;
  Descriptor *pDVar3;
  MapFieldBase *this_00;
  RepeatedPtrFieldBase *pRVar4;
  char *pcVar5;
  Nonnull<const_char_*> pcVar6;
  bool bVar7;
  char *method;
  string_view str;
  LogMessage local_50;
  LogMessage local_40;
  
  bVar1 = field->field_0x1;
  bVar7 = (bool)((bVar1 & 0x20) >> 5);
  if (0xbf < bVar1 == bVar7) {
    pcVar6 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       (bVar7,0xbf < bVar1,
                        "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar6 == (Nonnull<const_char_*>)0x0) {
    if ((field->field_0x1 & 0x20) != 0) {
      pDVar3 = this->descriptor_;
      if (field->containing_type_ == pDVar3) {
        if ((*(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != cpptype)
           && ((cpptype != CPPTYPE_INT32 ||
               (*(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) !=
                CPPTYPE_ENUM)))) {
          anon_unknown_6::ReportReflectionUsageTypeError
                    (this->descriptor_,field,"GetRawRepeatedField",cpptype);
        }
        if ((-1 < ctype) && (bVar7 = internal::IsMatchingCType(field,ctype), !bVar7)) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_50,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                     ,0xae2,"IsMatchingCType(field, ctype)");
          str._M_str = "subtype mismatch";
          str._M_len = 0x10;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    (&local_50,str);
          if (!bVar7) {
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_50);
          }
        }
        if (desc != (Descriptor *)0x0) {
          pDVar3 = FieldDescriptor::message_type(field);
          if (pDVar3 == desc) {
            pcVar6 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                               (pDVar3,desc,"field->message_type() == desc");
          }
          if (pcVar6 != (Nonnull<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_40,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                       ,0xae4,pcVar6);
            absl::lts_20250127::log_internal::LogMessage::operator<<
                      (&local_40,(char (*) [22])"wrong submessage type");
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_40);
          }
        }
        if ((field->field_0x1 & 8) == 0) {
          if ((field->type_ == '\v') && (bVar7 = FieldDescriptor::is_map_message_type(field), bVar7)
             ) {
            this_00 = GetRawNonOneof<google::protobuf::internal::MapFieldBase>(this,message,field);
            pRVar4 = internal::MapFieldBase::GetRepeatedField(this_00);
            return pRVar4;
          }
          pcVar5 = GetRawNonOneof<char>(this,message,field);
        }
        else {
          uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
          pcVar5 = (char *)internal::ExtensionSet::GetRawRepeatedField
                                     ((ExtensionSet *)
                                      ((long)&(message->super_MessageLite)._vptr_MessageLite +
                                      (ulong)uVar2),field->number_,internal::kZeroBuffer);
        }
        return pcVar5;
      }
      method = "GetRawRepeatedField";
      pcVar5 = "Field does not match message type.";
      goto LAB_002617c3;
    }
  }
  else {
    GetRawRepeatedField();
  }
  pDVar3 = this->descriptor_;
  method = "\"GetRawRepeatedField\"";
  pcVar5 = "Field is singular; the method requires a repeated field.";
LAB_002617c3:
  anon_unknown_6::ReportReflectionUsageError(pDVar3,field,method,pcVar5);
}

Assistant:

const void* Reflection::GetRawRepeatedField(const Message& message,
                                            const FieldDescriptor* field,
                                            FieldDescriptor::CppType cpptype,
                                            int ctype,
                                            const Descriptor* desc) const {
  USAGE_CHECK_REPEATED("GetRawRepeatedField");
  USAGE_CHECK_MESSAGE_TYPE(GetRawRepeatedField);
  if (field->cpp_type() != cpptype &&
      (field->cpp_type() != FieldDescriptor::CPPTYPE_ENUM ||
       cpptype != FieldDescriptor::CPPTYPE_INT32))
    ReportReflectionUsageTypeError(descriptor_, field, "GetRawRepeatedField",
                                   cpptype);
  if (ctype >= 0)
    ABSL_CHECK(IsMatchingCType(field, ctype)) << "subtype mismatch";
  if (desc != nullptr)
    ABSL_CHECK_EQ(field->message_type(), desc) << "wrong submessage type";
  if (field->is_extension()) {
    return GetExtensionSet(message).GetRawRepeatedField(
        field->number(), internal::DefaultRawPtr());
  } else {
    // Trigger transform for MapField
    if (IsMapFieldInApi(field)) {
      return &(GetRawNonOneof<MapFieldBase>(message, field).GetRepeatedField());
    }
    return &GetRawNonOneof<char>(message, field);
  }
}